

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void __thiscall
glcts::anon_unknown_0::UniformType::UniformType
          (UniformType *this,UniformStructCounter *structCounter,
          vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
          *_childTypes,int _arraySize)

{
  int *__args;
  iterator __position;
  int iVar1;
  ostringstream _str;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  this->enumType = 0;
  (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->arraySize = _arraySize;
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::vector(&this->childTypes,_childTypes);
  (this->strType)._M_dataplus._M_p = (pointer)&(this->strType).field_2;
  (this->strType)._M_string_length = 0;
  (this->strType).field_2._M_local_buf[0] = '\0';
  (this->refStrType)._M_dataplus._M_p = (pointer)&(this->refStrType).field_2;
  (this->refStrType)._M_string_length = 0;
  (this->refStrType).field_2._M_local_buf[0] = '\0';
  (this->size).first = 0;
  (this->size).second = 0;
  this->isArray = 0 < _arraySize;
  this->signedType = true;
  this->baseType = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"S",1);
  iVar1 = structCounter->counter;
  structCounter->counter = iVar1 + 1;
  std::ostream::operator<<(local_1a8,iVar1);
  std::__cxx11::stringbuf::str();
  __args = &this->arraySize;
  std::__cxx11::string::operator=((string *)&this->strType,(string *)local_1c8);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  iVar1 = *__args;
  if (iVar1 == 0) {
    *__args = 1;
    iVar1 = 1;
  }
  __position._M_current =
       (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->arraySizesSegmented,__position,__args);
  }
  else {
    *__position._M_current = iVar1;
    (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

UniformType(UniformStructCounter& structCounter, std::vector<UniformType> _childTypes, int _arraySize = 0)
		: enumType(0), arraySize(_arraySize), childTypes(_childTypes), isArray(_arraySize > 0), signedType(true)
	{
		baseType = 0;
		std::ostringstream _str;
		_str << "S" << structCounter.getNextCount();
		strType = _str.str();
		if (!arraySize)
		{
			arraySize = 1;
		}
		arraySizesSegmented.push_back(arraySize);
	}